

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_avx2_256_8.c
# Opt level: O0

parasail_result_t *
parasail_nw_diag_avx2_256_8
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  char cVar79;
  char cVar80;
  char cVar81;
  char cVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  uint uVar96;
  byte bVar97;
  int iVar98;
  int8_t *ptr;
  int8_t *ptr_00;
  int8_t *ptr_01;
  uint in_ECX;
  long in_RDX;
  char cVar99;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  undefined1 auVar101 [16];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  long in_stack_00000008;
  int8_t value;
  __m256i cond_all;
  __m256i cond_valid_J;
  __m256i cond_valid_I;
  __m256i cond;
  __m256i vNWH;
  __m256i vMat;
  int *matrow31;
  int *matrow30;
  int *matrow29;
  int *matrow28;
  int *matrow27;
  int *matrow26;
  int *matrow25;
  int *matrow24;
  int *matrow23;
  int *matrow22;
  int *matrow21;
  int *matrow20;
  int *matrow19;
  int *matrow18;
  int *matrow17;
  int *matrow16;
  int *matrow15;
  int *matrow14;
  int *matrow13;
  int *matrow12;
  int *matrow11;
  int *matrow10;
  int *matrow9;
  int *matrow8;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m256i vJ;
  __m256i vF;
  __m256i vE;
  __m256i vWH;
  __m256i vNH;
  __m256i vIBoundary;
  __m256i vJLimit1;
  __m256i vJLimit;
  __m256i vILimit1;
  __m256i vILimit;
  __m256i vMax;
  __m256i vJreset;
  __m256i vI;
  __m256i vNegOne;
  __m256i vGapN;
  __m256i vN;
  __m256i vOne;
  __m256i vGap;
  __m256i vOpen;
  __m256i vNegInf;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int8_t score;
  int8_t POS_LIMIT;
  int8_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int8_t *F_pr;
  int8_t *H_pr;
  int8_t *s2;
  int8_t *_F_pr;
  int8_t *_H_pr;
  int8_t *s2B;
  int8_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int local_1538;
  int local_1534;
  int local_1520;
  int local_151c;
  int local_1508;
  int local_1504;
  int local_14f0;
  int local_14ec;
  int local_14d8;
  int local_14d4;
  int local_14c0;
  int local_14bc;
  int local_14a8;
  int local_14a4;
  int local_1490;
  int local_148c;
  int local_1478;
  int local_1474;
  int local_1460;
  int local_145c;
  int local_1448;
  int local_1444;
  int local_1430;
  int local_142c;
  int local_1418;
  int local_1414;
  int local_1400;
  int local_13fc;
  int local_13e8;
  int local_13e4;
  int local_13d0;
  int local_13cc;
  int local_13b8;
  int local_13b4;
  int local_13a0;
  int local_139c;
  int local_1388;
  int local_1384;
  int local_1370;
  int local_136c;
  int local_1358;
  int local_1354;
  int local_1340;
  int local_133c;
  int local_1328;
  int local_1324;
  int local_1310;
  int local_130c;
  int local_12f8;
  int local_12f4;
  int local_12e0;
  int local_12dc;
  int local_12c8;
  int local_12c4;
  int local_12b0;
  int local_12ac;
  int local_1298;
  int local_1294;
  int local_1280;
  int local_127c;
  int local_1268;
  int local_1264;
  int local_1250;
  int local_124c;
  uint local_1208;
  undefined1 local_1040 [32];
  undefined1 local_1020 [24];
  undefined8 uStack_1008;
  undefined1 local_1000 [32];
  undefined1 local_fe0 [24];
  undefined8 uStack_fc8;
  undefined1 local_fc0 [24];
  undefined8 uStack_fa8;
  undefined1 local_fa0 [32];
  undefined1 local_f00 [32];
  undefined1 local_ec0 [32];
  undefined1 local_dc0 [32];
  undefined1 local_da0 [32];
  byte local_d2b;
  int local_d28;
  int local_d24;
  uint local_d20;
  uint local_d1c;
  int8_t *local_ce0;
  byte local_ccc;
  byte local_cbc;
  byte local_cb8;
  byte local_cb4;
  parasail_result_t *local_c98;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  
  local_ce0 = (int8_t *)0x0;
  if (in_RDX == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_diag_avx2_256_8","_s2");
    local_c98 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_diag_avx2_256_8","s2Len");
    local_c98 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_diag_avx2_256_8","open");
    local_c98 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R9D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_diag_avx2_256_8","gap");
    local_c98 = (parasail_result_t *)0x0;
  }
  else if (in_stack_00000008 == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_diag_avx2_256_8","matrix");
    local_c98 = (parasail_result_t *)0x0;
  }
  else {
    if (*(int *)(in_stack_00000008 + 0x30) == 0) {
      if (in_RDI == 0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_nw_diag_avx2_256_8","_s1");
        return (parasail_result_t *)0x0;
      }
      if ((int)in_ESI < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_diag_avx2_256_8","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_1208 = in_ESI;
    if (*(int *)(in_stack_00000008 + 0x30) != 0) {
      local_1208 = *(uint *)(in_stack_00000008 + 0x34);
    }
    local_d24 = local_1208 - 1;
    local_d28 = in_ECX - 1;
    local_cb8 = (byte)in_R8D;
    local_d2b = local_cb8;
    if (*(int *)(in_stack_00000008 + 0x20) <= (int)-in_R8D) {
      local_d2b = -(char)*(undefined4 *)(in_stack_00000008 + 0x20);
    }
    local_d2b = local_d2b + 0x81;
    bVar97 = (*(byte *)(in_stack_00000008 + 0x1c) ^ 0x7f) - 1;
    auVar65 = vpinsrb_avx(ZEXT116(local_d2b),(uint)local_d2b,1);
    auVar65 = vpinsrb_avx(auVar65,(uint)local_d2b,2);
    auVar65 = vpinsrb_avx(auVar65,(uint)local_d2b,3);
    auVar65 = vpinsrb_avx(auVar65,(uint)local_d2b,4);
    auVar65 = vpinsrb_avx(auVar65,(uint)local_d2b,5);
    auVar65 = vpinsrb_avx(auVar65,(uint)local_d2b,6);
    auVar65 = vpinsrb_avx(auVar65,(uint)local_d2b,7);
    auVar65 = vpinsrb_avx(auVar65,(uint)local_d2b,8);
    auVar65 = vpinsrb_avx(auVar65,(uint)local_d2b,9);
    auVar65 = vpinsrb_avx(auVar65,(uint)local_d2b,10);
    auVar65 = vpinsrb_avx(auVar65,(uint)local_d2b,0xb);
    auVar65 = vpinsrb_avx(auVar65,(uint)local_d2b,0xc);
    auVar65 = vpinsrb_avx(auVar65,(uint)local_d2b,0xd);
    auVar65 = vpinsrb_avx(auVar65,(uint)local_d2b,0xe);
    auVar65 = vpinsrb_avx(auVar65,(uint)local_d2b,0xf);
    auVar66 = vpinsrb_avx(ZEXT116(local_d2b),(uint)local_d2b,1);
    auVar66 = vpinsrb_avx(auVar66,(uint)local_d2b,2);
    auVar66 = vpinsrb_avx(auVar66,(uint)local_d2b,3);
    auVar66 = vpinsrb_avx(auVar66,(uint)local_d2b,4);
    auVar66 = vpinsrb_avx(auVar66,(uint)local_d2b,5);
    auVar66 = vpinsrb_avx(auVar66,(uint)local_d2b,6);
    auVar66 = vpinsrb_avx(auVar66,(uint)local_d2b,7);
    auVar66 = vpinsrb_avx(auVar66,(uint)local_d2b,8);
    auVar66 = vpinsrb_avx(auVar66,(uint)local_d2b,9);
    auVar66 = vpinsrb_avx(auVar66,(uint)local_d2b,10);
    auVar66 = vpinsrb_avx(auVar66,(uint)local_d2b,0xb);
    auVar66 = vpinsrb_avx(auVar66,(uint)local_d2b,0xc);
    auVar66 = vpinsrb_avx(auVar66,(uint)local_d2b,0xd);
    auVar66 = vpinsrb_avx(auVar66,(uint)local_d2b,0xe);
    auVar66 = vpinsrb_avx(auVar66,(uint)local_d2b,0xf);
    uStack_c70 = auVar66._0_8_;
    uStack_c68 = auVar66._8_8_;
    auVar66 = vpinsrb_avx(ZEXT116(bVar97),(uint)bVar97,1);
    auVar66 = vpinsrb_avx(auVar66,(uint)bVar97,2);
    auVar66 = vpinsrb_avx(auVar66,(uint)bVar97,3);
    auVar66 = vpinsrb_avx(auVar66,(uint)bVar97,4);
    auVar66 = vpinsrb_avx(auVar66,(uint)bVar97,5);
    auVar66 = vpinsrb_avx(auVar66,(uint)bVar97,6);
    auVar66 = vpinsrb_avx(auVar66,(uint)bVar97,7);
    auVar66 = vpinsrb_avx(auVar66,(uint)bVar97,8);
    auVar66 = vpinsrb_avx(auVar66,(uint)bVar97,9);
    auVar66 = vpinsrb_avx(auVar66,(uint)bVar97,10);
    auVar66 = vpinsrb_avx(auVar66,(uint)bVar97,0xb);
    auVar66 = vpinsrb_avx(auVar66,(uint)bVar97,0xc);
    auVar66 = vpinsrb_avx(auVar66,(uint)bVar97,0xd);
    auVar66 = vpinsrb_avx(auVar66,(uint)bVar97,0xe);
    auVar66 = vpinsrb_avx(auVar66,(uint)bVar97,0xf);
    auVar67 = vpinsrb_avx(ZEXT116(bVar97),(uint)bVar97,1);
    auVar67 = vpinsrb_avx(auVar67,(uint)bVar97,2);
    auVar67 = vpinsrb_avx(auVar67,(uint)bVar97,3);
    auVar67 = vpinsrb_avx(auVar67,(uint)bVar97,4);
    auVar67 = vpinsrb_avx(auVar67,(uint)bVar97,5);
    auVar67 = vpinsrb_avx(auVar67,(uint)bVar97,6);
    auVar67 = vpinsrb_avx(auVar67,(uint)bVar97,7);
    auVar67 = vpinsrb_avx(auVar67,(uint)bVar97,8);
    auVar67 = vpinsrb_avx(auVar67,(uint)bVar97,9);
    auVar67 = vpinsrb_avx(auVar67,(uint)bVar97,10);
    auVar67 = vpinsrb_avx(auVar67,(uint)bVar97,0xb);
    auVar67 = vpinsrb_avx(auVar67,(uint)bVar97,0xc);
    auVar67 = vpinsrb_avx(auVar67,(uint)bVar97,0xd);
    auVar67 = vpinsrb_avx(auVar67,(uint)bVar97,0xe);
    auVar67 = vpinsrb_avx(auVar67,(uint)bVar97,0xf);
    uStack_c30 = auVar67._0_8_;
    uStack_c28 = auVar67._8_8_;
    local_da0._16_8_ = uStack_c30;
    local_da0._0_16_ = auVar66;
    local_da0._24_8_ = uStack_c28;
    local_dc0._16_8_ = uStack_c70;
    local_dc0._0_16_ = auVar65;
    local_dc0._24_8_ = uStack_c68;
    auVar67 = vpinsrb_avx(ZEXT116(local_d2b),(uint)local_d2b,1);
    auVar67 = vpinsrb_avx(auVar67,(uint)local_d2b,2);
    auVar67 = vpinsrb_avx(auVar67,(uint)local_d2b,3);
    auVar67 = vpinsrb_avx(auVar67,(uint)local_d2b,4);
    auVar67 = vpinsrb_avx(auVar67,(uint)local_d2b,5);
    auVar67 = vpinsrb_avx(auVar67,(uint)local_d2b,6);
    auVar67 = vpinsrb_avx(auVar67,(uint)local_d2b,7);
    auVar67 = vpinsrb_avx(auVar67,(uint)local_d2b,8);
    auVar67 = vpinsrb_avx(auVar67,(uint)local_d2b,9);
    auVar67 = vpinsrb_avx(auVar67,(uint)local_d2b,10);
    auVar67 = vpinsrb_avx(auVar67,(uint)local_d2b,0xb);
    auVar67 = vpinsrb_avx(auVar67,(uint)local_d2b,0xc);
    auVar67 = vpinsrb_avx(auVar67,(uint)local_d2b,0xd);
    auVar67 = vpinsrb_avx(auVar67,(uint)local_d2b,0xe);
    auVar67 = vpinsrb_avx(auVar67,(uint)local_d2b,0xf);
    auVar68 = vpinsrb_avx(ZEXT116(local_d2b),(uint)local_d2b,1);
    auVar68 = vpinsrb_avx(auVar68,(uint)local_d2b,2);
    auVar68 = vpinsrb_avx(auVar68,(uint)local_d2b,3);
    auVar68 = vpinsrb_avx(auVar68,(uint)local_d2b,4);
    auVar68 = vpinsrb_avx(auVar68,(uint)local_d2b,5);
    auVar68 = vpinsrb_avx(auVar68,(uint)local_d2b,6);
    auVar68 = vpinsrb_avx(auVar68,(uint)local_d2b,7);
    auVar68 = vpinsrb_avx(auVar68,(uint)local_d2b,8);
    auVar68 = vpinsrb_avx(auVar68,(uint)local_d2b,9);
    auVar68 = vpinsrb_avx(auVar68,(uint)local_d2b,10);
    auVar68 = vpinsrb_avx(auVar68,(uint)local_d2b,0xb);
    auVar68 = vpinsrb_avx(auVar68,(uint)local_d2b,0xc);
    auVar68 = vpinsrb_avx(auVar68,(uint)local_d2b,0xd);
    auVar68 = vpinsrb_avx(auVar68,(uint)local_d2b,0xe);
    auVar68 = vpinsrb_avx(auVar68,(uint)local_d2b,0xf);
    uStack_bf0 = auVar68._0_8_;
    uStack_be8 = auVar68._8_8_;
    auVar68 = vpinsrb_avx(ZEXT116(local_cb8),in_R8D & 0xff,1);
    auVar68 = vpinsrb_avx(auVar68,in_R8D & 0xff,2);
    auVar68 = vpinsrb_avx(auVar68,in_R8D & 0xff,3);
    auVar68 = vpinsrb_avx(auVar68,in_R8D & 0xff,4);
    auVar68 = vpinsrb_avx(auVar68,in_R8D & 0xff,5);
    auVar68 = vpinsrb_avx(auVar68,in_R8D & 0xff,6);
    auVar68 = vpinsrb_avx(auVar68,in_R8D & 0xff,7);
    auVar68 = vpinsrb_avx(auVar68,in_R8D & 0xff,8);
    auVar68 = vpinsrb_avx(auVar68,in_R8D & 0xff,9);
    auVar68 = vpinsrb_avx(auVar68,in_R8D & 0xff,10);
    auVar68 = vpinsrb_avx(auVar68,in_R8D & 0xff,0xb);
    auVar68 = vpinsrb_avx(auVar68,in_R8D & 0xff,0xc);
    auVar68 = vpinsrb_avx(auVar68,in_R8D & 0xff,0xd);
    auVar68 = vpinsrb_avx(auVar68,in_R8D & 0xff,0xe);
    auVar68 = vpinsrb_avx(auVar68,in_R8D & 0xff,0xf);
    auVar69 = vpinsrb_avx(ZEXT116(local_cb8),in_R8D & 0xff,1);
    auVar69 = vpinsrb_avx(auVar69,in_R8D & 0xff,2);
    auVar69 = vpinsrb_avx(auVar69,in_R8D & 0xff,3);
    auVar69 = vpinsrb_avx(auVar69,in_R8D & 0xff,4);
    auVar69 = vpinsrb_avx(auVar69,in_R8D & 0xff,5);
    auVar69 = vpinsrb_avx(auVar69,in_R8D & 0xff,6);
    auVar69 = vpinsrb_avx(auVar69,in_R8D & 0xff,7);
    auVar69 = vpinsrb_avx(auVar69,in_R8D & 0xff,8);
    auVar69 = vpinsrb_avx(auVar69,in_R8D & 0xff,9);
    auVar69 = vpinsrb_avx(auVar69,in_R8D & 0xff,10);
    auVar69 = vpinsrb_avx(auVar69,in_R8D & 0xff,0xb);
    auVar69 = vpinsrb_avx(auVar69,in_R8D & 0xff,0xc);
    auVar69 = vpinsrb_avx(auVar69,in_R8D & 0xff,0xd);
    auVar69 = vpinsrb_avx(auVar69,in_R8D & 0xff,0xe);
    auVar69 = vpinsrb_avx(auVar69,in_R8D & 0xff,0xf);
    uStack_bb0 = auVar69._0_8_;
    uStack_ba8 = auVar69._8_8_;
    local_cbc = (byte)in_R9D;
    auVar69 = vpinsrb_avx(ZEXT116(local_cbc),in_R9D & 0xff,1);
    auVar69 = vpinsrb_avx(auVar69,in_R9D & 0xff,2);
    auVar69 = vpinsrb_avx(auVar69,in_R9D & 0xff,3);
    auVar69 = vpinsrb_avx(auVar69,in_R9D & 0xff,4);
    auVar69 = vpinsrb_avx(auVar69,in_R9D & 0xff,5);
    auVar69 = vpinsrb_avx(auVar69,in_R9D & 0xff,6);
    auVar69 = vpinsrb_avx(auVar69,in_R9D & 0xff,7);
    auVar69 = vpinsrb_avx(auVar69,in_R9D & 0xff,8);
    auVar69 = vpinsrb_avx(auVar69,in_R9D & 0xff,9);
    auVar69 = vpinsrb_avx(auVar69,in_R9D & 0xff,10);
    auVar69 = vpinsrb_avx(auVar69,in_R9D & 0xff,0xb);
    auVar69 = vpinsrb_avx(auVar69,in_R9D & 0xff,0xc);
    auVar69 = vpinsrb_avx(auVar69,in_R9D & 0xff,0xd);
    auVar69 = vpinsrb_avx(auVar69,in_R9D & 0xff,0xe);
    auVar69 = vpinsrb_avx(auVar69,in_R9D & 0xff,0xf);
    auVar70 = vpinsrb_avx(ZEXT116(local_cbc),in_R9D & 0xff,1);
    auVar70 = vpinsrb_avx(auVar70,in_R9D & 0xff,2);
    auVar70 = vpinsrb_avx(auVar70,in_R9D & 0xff,3);
    auVar70 = vpinsrb_avx(auVar70,in_R9D & 0xff,4);
    auVar70 = vpinsrb_avx(auVar70,in_R9D & 0xff,5);
    auVar70 = vpinsrb_avx(auVar70,in_R9D & 0xff,6);
    auVar70 = vpinsrb_avx(auVar70,in_R9D & 0xff,7);
    auVar70 = vpinsrb_avx(auVar70,in_R9D & 0xff,8);
    auVar70 = vpinsrb_avx(auVar70,in_R9D & 0xff,9);
    auVar70 = vpinsrb_avx(auVar70,in_R9D & 0xff,10);
    auVar70 = vpinsrb_avx(auVar70,in_R9D & 0xff,0xb);
    auVar70 = vpinsrb_avx(auVar70,in_R9D & 0xff,0xc);
    auVar70 = vpinsrb_avx(auVar70,in_R9D & 0xff,0xd);
    auVar70 = vpinsrb_avx(auVar70,in_R9D & 0xff,0xe);
    auVar70 = vpinsrb_avx(auVar70,in_R9D & 0xff,0xf);
    uStack_b70 = auVar70._0_8_;
    uStack_b68 = auVar70._8_8_;
    auVar70 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar70 = vpinsrb_avx(auVar70,1,2);
    auVar70 = vpinsrb_avx(auVar70,1,3);
    auVar70 = vpinsrb_avx(auVar70,1,4);
    auVar70 = vpinsrb_avx(auVar70,1,5);
    auVar70 = vpinsrb_avx(auVar70,1,6);
    auVar70 = vpinsrb_avx(auVar70,1,7);
    auVar70 = vpinsrb_avx(auVar70,1,8);
    auVar70 = vpinsrb_avx(auVar70,1,9);
    auVar70 = vpinsrb_avx(auVar70,1,10);
    auVar70 = vpinsrb_avx(auVar70,1,0xb);
    auVar70 = vpinsrb_avx(auVar70,1,0xc);
    auVar70 = vpinsrb_avx(auVar70,1,0xd);
    auVar70 = vpinsrb_avx(auVar70,1,0xe);
    auVar70 = vpinsrb_avx(auVar70,1,0xf);
    auVar71 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar71 = vpinsrb_avx(auVar71,1,2);
    auVar71 = vpinsrb_avx(auVar71,1,3);
    auVar71 = vpinsrb_avx(auVar71,1,4);
    auVar71 = vpinsrb_avx(auVar71,1,5);
    auVar71 = vpinsrb_avx(auVar71,1,6);
    auVar71 = vpinsrb_avx(auVar71,1,7);
    auVar71 = vpinsrb_avx(auVar71,1,8);
    auVar71 = vpinsrb_avx(auVar71,1,9);
    auVar71 = vpinsrb_avx(auVar71,1,10);
    auVar71 = vpinsrb_avx(auVar71,1,0xb);
    auVar71 = vpinsrb_avx(auVar71,1,0xc);
    auVar71 = vpinsrb_avx(auVar71,1,0xd);
    auVar71 = vpinsrb_avx(auVar71,1,0xe);
    auVar71 = vpinsrb_avx(auVar71,1,0xf);
    uStack_b30 = auVar71._0_8_;
    uStack_b28 = auVar71._8_8_;
    auVar71 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
    auVar71 = vpinsrb_avx(auVar71,0x20,2);
    auVar71 = vpinsrb_avx(auVar71,0x20,3);
    auVar71 = vpinsrb_avx(auVar71,0x20,4);
    auVar71 = vpinsrb_avx(auVar71,0x20,5);
    auVar71 = vpinsrb_avx(auVar71,0x20,6);
    auVar71 = vpinsrb_avx(auVar71,0x20,7);
    auVar71 = vpinsrb_avx(auVar71,0x20,8);
    auVar71 = vpinsrb_avx(auVar71,0x20,9);
    auVar71 = vpinsrb_avx(auVar71,0x20,10);
    auVar71 = vpinsrb_avx(auVar71,0x20,0xb);
    auVar71 = vpinsrb_avx(auVar71,0x20,0xc);
    auVar71 = vpinsrb_avx(auVar71,0x20,0xd);
    auVar71 = vpinsrb_avx(auVar71,0x20,0xe);
    auVar71 = vpinsrb_avx(auVar71,0x20,0xf);
    auVar72 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
    auVar72 = vpinsrb_avx(auVar72,0x20,2);
    auVar72 = vpinsrb_avx(auVar72,0x20,3);
    auVar72 = vpinsrb_avx(auVar72,0x20,4);
    auVar72 = vpinsrb_avx(auVar72,0x20,5);
    auVar72 = vpinsrb_avx(auVar72,0x20,6);
    auVar72 = vpinsrb_avx(auVar72,0x20,7);
    auVar72 = vpinsrb_avx(auVar72,0x20,8);
    auVar72 = vpinsrb_avx(auVar72,0x20,9);
    auVar72 = vpinsrb_avx(auVar72,0x20,10);
    auVar72 = vpinsrb_avx(auVar72,0x20,0xb);
    auVar72 = vpinsrb_avx(auVar72,0x20,0xc);
    auVar72 = vpinsrb_avx(auVar72,0x20,0xd);
    auVar72 = vpinsrb_avx(auVar72,0x20,0xe);
    auVar72 = vpinsrb_avx(auVar72,0x20,0xf);
    uStack_af0 = auVar72._0_8_;
    uStack_ae8 = auVar72._8_8_;
    bVar97 = local_cbc * ' ';
    auVar72 = vpinsrb_avx(ZEXT116(bVar97),(uint)bVar97,1);
    auVar72 = vpinsrb_avx(auVar72,(uint)bVar97,2);
    auVar72 = vpinsrb_avx(auVar72,(uint)bVar97,3);
    auVar72 = vpinsrb_avx(auVar72,(uint)bVar97,4);
    auVar72 = vpinsrb_avx(auVar72,(uint)bVar97,5);
    auVar72 = vpinsrb_avx(auVar72,(uint)bVar97,6);
    auVar72 = vpinsrb_avx(auVar72,(uint)bVar97,7);
    auVar72 = vpinsrb_avx(auVar72,(uint)bVar97,8);
    auVar72 = vpinsrb_avx(auVar72,(uint)bVar97,9);
    auVar72 = vpinsrb_avx(auVar72,(uint)bVar97,10);
    auVar72 = vpinsrb_avx(auVar72,(uint)bVar97,0xb);
    auVar72 = vpinsrb_avx(auVar72,(uint)bVar97,0xc);
    auVar72 = vpinsrb_avx(auVar72,(uint)bVar97,0xd);
    auVar72 = vpinsrb_avx(auVar72,(uint)bVar97,0xe);
    auVar72 = vpinsrb_avx(auVar72,(uint)bVar97,0xf);
    auVar73 = vpinsrb_avx(ZEXT116(bVar97),(uint)bVar97,1);
    auVar73 = vpinsrb_avx(auVar73,(uint)bVar97,2);
    auVar73 = vpinsrb_avx(auVar73,(uint)bVar97,3);
    auVar73 = vpinsrb_avx(auVar73,(uint)bVar97,4);
    auVar73 = vpinsrb_avx(auVar73,(uint)bVar97,5);
    auVar73 = vpinsrb_avx(auVar73,(uint)bVar97,6);
    auVar73 = vpinsrb_avx(auVar73,(uint)bVar97,7);
    auVar73 = vpinsrb_avx(auVar73,(uint)bVar97,8);
    auVar73 = vpinsrb_avx(auVar73,(uint)bVar97,9);
    auVar73 = vpinsrb_avx(auVar73,(uint)bVar97,10);
    auVar73 = vpinsrb_avx(auVar73,(uint)bVar97,0xb);
    auVar73 = vpinsrb_avx(auVar73,(uint)bVar97,0xc);
    auVar73 = vpinsrb_avx(auVar73,(uint)bVar97,0xd);
    auVar73 = vpinsrb_avx(auVar73,(uint)bVar97,0xe);
    auVar73 = vpinsrb_avx(auVar73,(uint)bVar97,0xf);
    uStack_ab0 = auVar73._0_8_;
    uStack_aa8 = auVar73._8_8_;
    auVar73 = vpinsrb_avx(ZEXT116(0xff),0xff,1);
    auVar73 = vpinsrb_avx(auVar73,0xff,2);
    auVar73 = vpinsrb_avx(auVar73,0xff,3);
    auVar73 = vpinsrb_avx(auVar73,0xff,4);
    auVar73 = vpinsrb_avx(auVar73,0xff,5);
    auVar73 = vpinsrb_avx(auVar73,0xff,6);
    auVar73 = vpinsrb_avx(auVar73,0xff,7);
    auVar73 = vpinsrb_avx(auVar73,0xff,8);
    auVar73 = vpinsrb_avx(auVar73,0xff,9);
    auVar73 = vpinsrb_avx(auVar73,0xff,10);
    auVar73 = vpinsrb_avx(auVar73,0xff,0xb);
    auVar73 = vpinsrb_avx(auVar73,0xff,0xc);
    auVar73 = vpinsrb_avx(auVar73,0xff,0xd);
    auVar73 = vpinsrb_avx(auVar73,0xff,0xe);
    auVar73 = vpinsrb_avx(auVar73,0xff,0xf);
    auVar74 = vpinsrb_avx(ZEXT116(0xff),0xff,1);
    auVar74 = vpinsrb_avx(auVar74,0xff,2);
    auVar74 = vpinsrb_avx(auVar74,0xff,3);
    auVar74 = vpinsrb_avx(auVar74,0xff,4);
    auVar74 = vpinsrb_avx(auVar74,0xff,5);
    auVar74 = vpinsrb_avx(auVar74,0xff,6);
    auVar74 = vpinsrb_avx(auVar74,0xff,7);
    auVar74 = vpinsrb_avx(auVar74,0xff,8);
    auVar74 = vpinsrb_avx(auVar74,0xff,9);
    auVar74 = vpinsrb_avx(auVar74,0xff,10);
    auVar74 = vpinsrb_avx(auVar74,0xff,0xb);
    auVar74 = vpinsrb_avx(auVar74,0xff,0xc);
    auVar74 = vpinsrb_avx(auVar74,0xff,0xd);
    auVar74 = vpinsrb_avx(auVar74,0xff,0xe);
    auVar74 = vpinsrb_avx(auVar74,0xff,0xf);
    uStack_a70 = auVar74._0_8_;
    uStack_a68 = auVar74._8_8_;
    auVar74 = vpinsrb_avx(ZEXT116(0x1f),0x1e,1);
    auVar74 = vpinsrb_avx(auVar74,0x1d,2);
    auVar74 = vpinsrb_avx(auVar74,0x1c,3);
    auVar74 = vpinsrb_avx(auVar74,0x1b,4);
    auVar74 = vpinsrb_avx(auVar74,0x1a,5);
    auVar74 = vpinsrb_avx(auVar74,0x19,6);
    auVar74 = vpinsrb_avx(auVar74,0x18,7);
    auVar74 = vpinsrb_avx(auVar74,0x17,8);
    auVar74 = vpinsrb_avx(auVar74,0x16,9);
    auVar74 = vpinsrb_avx(auVar74,0x15,10);
    auVar74 = vpinsrb_avx(auVar74,0x14,0xb);
    auVar74 = vpinsrb_avx(auVar74,0x13,0xc);
    auVar74 = vpinsrb_avx(auVar74,0x12,0xd);
    auVar74 = vpinsrb_avx(auVar74,0x11,0xe);
    local_ec0._0_16_ = vpinsrb_avx(auVar74,0x10,0xf);
    auVar74 = vpinsrb_avx(ZEXT116(0xf),0xe,1);
    auVar74 = vpinsrb_avx(auVar74,0xd,2);
    auVar74 = vpinsrb_avx(auVar74,0xc,3);
    auVar74 = vpinsrb_avx(auVar74,0xb,4);
    auVar74 = vpinsrb_avx(auVar74,10,5);
    auVar74 = vpinsrb_avx(auVar74,9,6);
    auVar74 = vpinsrb_avx(auVar74,8,7);
    auVar74 = vpinsrb_avx(auVar74,7,8);
    auVar74 = vpinsrb_avx(auVar74,6,9);
    auVar74 = vpinsrb_avx(auVar74,5,10);
    auVar74 = vpinsrb_avx(auVar74,4,0xb);
    auVar74 = vpinsrb_avx(auVar74,3,0xc);
    auVar74 = vpinsrb_avx(auVar74,2,0xd);
    auVar74 = vpinsrb_avx(auVar74,1,0xe);
    auVar74 = vpinsrb_avx(auVar74,0,0xf);
    uStack_8f0 = auVar74._0_8_;
    uStack_8e8 = auVar74._8_8_;
    local_ec0._16_8_ = uStack_8f0;
    local_ec0._24_8_ = uStack_8e8;
    auVar74 = vpinsrb_avx(ZEXT116(0xe1),0xe2,1);
    auVar74 = vpinsrb_avx(auVar74,0xe3,2);
    auVar74 = vpinsrb_avx(auVar74,0xe4,3);
    auVar74 = vpinsrb_avx(auVar74,0xe5,4);
    auVar74 = vpinsrb_avx(auVar74,0xe6,5);
    auVar74 = vpinsrb_avx(auVar74,0xe7,6);
    auVar74 = vpinsrb_avx(auVar74,0xe8,7);
    auVar74 = vpinsrb_avx(auVar74,0xe9,8);
    auVar74 = vpinsrb_avx(auVar74,0xea,9);
    auVar74 = vpinsrb_avx(auVar74,0xeb,10);
    auVar74 = vpinsrb_avx(auVar74,0xec,0xb);
    auVar74 = vpinsrb_avx(auVar74,0xed,0xc);
    auVar74 = vpinsrb_avx(auVar74,0xee,0xd);
    auVar74 = vpinsrb_avx(auVar74,0xef,0xe);
    auVar74 = vpinsrb_avx(auVar74,0xf0,0xf);
    auVar75 = vpinsrb_avx(ZEXT116(0xf1),0xf2,1);
    auVar75 = vpinsrb_avx(auVar75,0xf3,2);
    auVar75 = vpinsrb_avx(auVar75,0xf4,3);
    auVar75 = vpinsrb_avx(auVar75,0xf5,4);
    auVar75 = vpinsrb_avx(auVar75,0xf6,5);
    auVar75 = vpinsrb_avx(auVar75,0xf7,6);
    auVar75 = vpinsrb_avx(auVar75,0xf8,7);
    auVar75 = vpinsrb_avx(auVar75,0xf9,8);
    auVar75 = vpinsrb_avx(auVar75,0xfa,9);
    auVar75 = vpinsrb_avx(auVar75,0xfb,10);
    auVar75 = vpinsrb_avx(auVar75,0xfc,0xb);
    auVar75 = vpinsrb_avx(auVar75,0xfd,0xc);
    auVar75 = vpinsrb_avx(auVar75,0xfe,0xd);
    auVar75 = vpinsrb_avx(auVar75,0xff,0xe);
    auVar75 = vpinsrb_avx(auVar75,0,0xf);
    uStack_930 = auVar75._0_8_;
    uStack_928 = auVar75._8_8_;
    local_f00._16_8_ = uStack_bf0;
    local_f00._0_16_ = auVar67;
    local_f00._24_8_ = uStack_be8;
    local_ccc = (byte)local_1208;
    auVar75 = vpinsrb_avx(ZEXT116(local_ccc),local_1208 & 0xff,1);
    auVar75 = vpinsrb_avx(auVar75,local_1208 & 0xff,2);
    auVar75 = vpinsrb_avx(auVar75,local_1208 & 0xff,3);
    auVar75 = vpinsrb_avx(auVar75,local_1208 & 0xff,4);
    auVar75 = vpinsrb_avx(auVar75,local_1208 & 0xff,5);
    auVar75 = vpinsrb_avx(auVar75,local_1208 & 0xff,6);
    auVar75 = vpinsrb_avx(auVar75,local_1208 & 0xff,7);
    auVar75 = vpinsrb_avx(auVar75,local_1208 & 0xff,8);
    auVar75 = vpinsrb_avx(auVar75,local_1208 & 0xff,9);
    auVar75 = vpinsrb_avx(auVar75,local_1208 & 0xff,10);
    auVar75 = vpinsrb_avx(auVar75,local_1208 & 0xff,0xb);
    auVar75 = vpinsrb_avx(auVar75,local_1208 & 0xff,0xc);
    auVar75 = vpinsrb_avx(auVar75,local_1208 & 0xff,0xd);
    auVar75 = vpinsrb_avx(auVar75,local_1208 & 0xff,0xe);
    auVar75 = vpinsrb_avx(auVar75,local_1208 & 0xff,0xf);
    auVar76 = vpinsrb_avx(ZEXT116(local_ccc),local_1208 & 0xff,1);
    auVar76 = vpinsrb_avx(auVar76,local_1208 & 0xff,2);
    auVar76 = vpinsrb_avx(auVar76,local_1208 & 0xff,3);
    auVar76 = vpinsrb_avx(auVar76,local_1208 & 0xff,4);
    auVar76 = vpinsrb_avx(auVar76,local_1208 & 0xff,5);
    auVar76 = vpinsrb_avx(auVar76,local_1208 & 0xff,6);
    auVar76 = vpinsrb_avx(auVar76,local_1208 & 0xff,7);
    auVar76 = vpinsrb_avx(auVar76,local_1208 & 0xff,8);
    auVar76 = vpinsrb_avx(auVar76,local_1208 & 0xff,9);
    auVar76 = vpinsrb_avx(auVar76,local_1208 & 0xff,10);
    auVar76 = vpinsrb_avx(auVar76,local_1208 & 0xff,0xb);
    auVar76 = vpinsrb_avx(auVar76,local_1208 & 0xff,0xc);
    auVar76 = vpinsrb_avx(auVar76,local_1208 & 0xff,0xd);
    auVar76 = vpinsrb_avx(auVar76,local_1208 & 0xff,0xe);
    auVar76 = vpinsrb_avx(auVar76,local_1208 & 0xff,0xf);
    uStack_a30 = auVar76._0_8_;
    uStack_a28 = auVar76._8_8_;
    auVar102._16_8_ = uStack_a30;
    auVar102._0_16_ = auVar75;
    auVar102._24_8_ = uStack_a28;
    auVar77._16_8_ = uStack_b30;
    auVar77._0_16_ = auVar70;
    auVar77._24_8_ = uStack_b28;
    auVar77 = vpsubsb_avx2(auVar102,auVar77);
    local_cb4 = (byte)in_ECX;
    auVar75 = vpinsrb_avx(ZEXT116(local_cb4),in_ECX & 0xff,1);
    auVar75 = vpinsrb_avx(auVar75,in_ECX & 0xff,2);
    auVar75 = vpinsrb_avx(auVar75,in_ECX & 0xff,3);
    auVar75 = vpinsrb_avx(auVar75,in_ECX & 0xff,4);
    auVar75 = vpinsrb_avx(auVar75,in_ECX & 0xff,5);
    auVar75 = vpinsrb_avx(auVar75,in_ECX & 0xff,6);
    auVar75 = vpinsrb_avx(auVar75,in_ECX & 0xff,7);
    auVar75 = vpinsrb_avx(auVar75,in_ECX & 0xff,8);
    auVar75 = vpinsrb_avx(auVar75,in_ECX & 0xff,9);
    auVar75 = vpinsrb_avx(auVar75,in_ECX & 0xff,10);
    auVar75 = vpinsrb_avx(auVar75,in_ECX & 0xff,0xb);
    auVar75 = vpinsrb_avx(auVar75,in_ECX & 0xff,0xc);
    auVar75 = vpinsrb_avx(auVar75,in_ECX & 0xff,0xd);
    auVar75 = vpinsrb_avx(auVar75,in_ECX & 0xff,0xe);
    auVar75 = vpinsrb_avx(auVar75,in_ECX & 0xff,0xf);
    auVar76 = vpinsrb_avx(ZEXT116(local_cb4),in_ECX & 0xff,1);
    auVar76 = vpinsrb_avx(auVar76,in_ECX & 0xff,2);
    auVar76 = vpinsrb_avx(auVar76,in_ECX & 0xff,3);
    auVar76 = vpinsrb_avx(auVar76,in_ECX & 0xff,4);
    auVar76 = vpinsrb_avx(auVar76,in_ECX & 0xff,5);
    auVar76 = vpinsrb_avx(auVar76,in_ECX & 0xff,6);
    auVar76 = vpinsrb_avx(auVar76,in_ECX & 0xff,7);
    auVar76 = vpinsrb_avx(auVar76,in_ECX & 0xff,8);
    auVar76 = vpinsrb_avx(auVar76,in_ECX & 0xff,9);
    auVar76 = vpinsrb_avx(auVar76,in_ECX & 0xff,10);
    auVar76 = vpinsrb_avx(auVar76,in_ECX & 0xff,0xb);
    auVar76 = vpinsrb_avx(auVar76,in_ECX & 0xff,0xc);
    auVar76 = vpinsrb_avx(auVar76,in_ECX & 0xff,0xd);
    auVar76 = vpinsrb_avx(auVar76,in_ECX & 0xff,0xe);
    auVar76 = vpinsrb_avx(auVar76,in_ECX & 0xff,0xf);
    uStack_9f0 = auVar76._0_8_;
    uStack_9e8 = auVar76._8_8_;
    auVar100._16_8_ = uStack_9f0;
    auVar100._0_16_ = auVar75;
    auVar100._24_8_ = uStack_9e8;
    auVar78._16_8_ = uStack_b30;
    auVar78._0_16_ = auVar70;
    auVar78._24_8_ = uStack_b28;
    auVar78 = vpsubsb_avx2(auVar100,auVar78);
    cVar99 = (char)-in_R8D;
    cVar79 = (char)(in_R9D << 2);
    cVar80 = (char)(in_R9D << 3);
    cVar81 = (char)(in_R9D << 4);
    cVar82 = (char)(in_R9D << 5);
    auVar75 = vpinsrb_avx(ZEXT116((byte)(cVar99 + local_cbc * -0xf)),
                          (uint)(byte)((local_cbc * '\x02' - cVar81) - local_cb8),1);
    auVar75 = vpinsrb_avx(auVar75,(uint)(byte)(cVar99 + local_cbc * -0xd),2);
    auVar75 = vpinsrb_avx(auVar75,(uint)(byte)(cVar99 + cVar79 * -3),3);
    auVar75 = vpinsrb_avx(auVar75,(uint)(byte)(cVar99 + local_cbc * -0xb),4);
    auVar75 = vpinsrb_avx(auVar75,(uint)(byte)(cVar99 + local_cbc * -10),5);
    auVar75 = vpinsrb_avx(auVar75,(uint)(byte)(cVar99 + local_cbc * -9),6);
    auVar75 = vpinsrb_avx(auVar75,(uint)(byte)(cVar99 - cVar80),7);
    auVar75 = vpinsrb_avx(auVar75,(uint)(byte)((local_cbc - cVar80) - local_cb8),8);
    auVar75 = vpinsrb_avx(auVar75,(uint)(byte)(cVar99 + local_cbc * -6),9);
    auVar75 = vpinsrb_avx(auVar75,(uint)(byte)(cVar99 + local_cbc * -5),10);
    auVar75 = vpinsrb_avx(auVar75,(uint)(byte)(cVar99 - cVar79),0xb);
    auVar75 = vpinsrb_avx(auVar75,(uint)(byte)(cVar99 + local_cbc * -3),0xc);
    auVar75 = vpinsrb_avx(auVar75,(uint)(byte)(cVar99 + local_cbc * -2),0xd);
    auVar75 = vpinsrb_avx(auVar75,(uint)(byte)(cVar99 - local_cbc),0xe);
    auVar75 = vpinsrb_avx(auVar75,-in_R8D & 0xff,0xf);
    auVar76 = vpinsrb_avx(ZEXT116((byte)((local_cbc - cVar82) - local_cb8)),
                          (uint)(byte)((local_cbc * '\x02' - cVar82) - local_cb8),1);
    auVar76 = vpinsrb_avx(auVar76,(uint)(byte)(cVar99 + local_cbc * -0x1d),2);
    auVar76 = vpinsrb_avx(auVar76,(uint)(byte)(cVar99 + local_cbc * -0x1c),3);
    auVar76 = vpinsrb_avx(auVar76,(uint)(byte)(cVar99 + local_cbc * -0x1b),4);
    auVar76 = vpinsrb_avx(auVar76,(uint)(byte)(cVar99 + local_cbc * -0x1a),5);
    auVar76 = vpinsrb_avx(auVar76,(uint)(byte)(cVar99 + local_cbc * -0x19),6);
    auVar76 = vpinsrb_avx(auVar76,(uint)(byte)(cVar99 + cVar80 * -3),7);
    auVar76 = vpinsrb_avx(auVar76,(uint)(byte)(local_cbc * -0x17 - local_cb8),8);
    auVar76 = vpinsrb_avx(auVar76,(uint)(byte)(cVar99 + local_cbc * -0x16),9);
    auVar76 = vpinsrb_avx(auVar76,(uint)(byte)(cVar99 + local_cbc * -0x15),10);
    auVar76 = vpinsrb_avx(auVar76,(uint)(byte)(cVar99 + cVar79 * -5),0xb);
    auVar76 = vpinsrb_avx(auVar76,(uint)(byte)(cVar99 + local_cbc * -0x13),0xc);
    auVar76 = vpinsrb_avx(auVar76,(uint)(byte)(cVar99 + local_cbc * -0x12),0xd);
    auVar76 = vpinsrb_avx(auVar76,(uint)(byte)(cVar99 - (local_cbc + cVar81)),0xe);
    auVar76 = vpinsrb_avx(auVar76,(uint)(byte)(cVar99 - cVar81),0xf);
    auVar101 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar75;
    uStack_970 = auVar101._0_8_;
    uStack_968 = auVar101._8_8_;
    local_fa0._16_8_ = uStack_970;
    local_fa0._0_16_ = ZEXT116(0) * auVar75 + ZEXT116(1) * auVar76;
    local_fa0._24_8_ = uStack_968;
    auVar105 = ZEXT1664(auVar75);
    local_c98 = parasail_result_new();
    if (local_c98 == (parasail_result_t *)0x0) {
      local_c98 = (parasail_result_t *)0x0;
    }
    else {
      local_c98->flag = local_c98->flag | 0x20101001;
      ptr = parasail_memalign_int8_t(0x20,(long)(int)(in_ECX + 0x3e));
      ptr_00 = parasail_memalign_int8_t(0x20,(long)(int)(in_ECX + 0x3e));
      ptr_01 = parasail_memalign_int8_t(0x20,(long)(int)(in_ECX + 0x3e));
      if (ptr == (int8_t *)0x0) {
        local_c98 = (parasail_result_t *)0x0;
      }
      else if (ptr_00 == (int8_t *)0x0) {
        local_c98 = (parasail_result_t *)0x0;
      }
      else if (ptr_01 == (int8_t *)0x0) {
        local_c98 = (parasail_result_t *)0x0;
      }
      else {
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          local_ce0 = parasail_memalign_int8_t(0x20,(long)(int)(local_1208 + 0x1f));
          if (local_ce0 == (int8_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (local_d1c = 0; (int)local_d1c < (int)local_1208; local_d1c = local_d1c + 1) {
            local_ce0[(int)local_d1c] =
                 (int8_t)*(undefined4 *)
                          (*(long *)(in_stack_00000008 + 0x10) +
                          (ulong)*(byte *)(in_RDI + (int)local_d1c) * 4);
          }
          for (local_d1c = local_1208; (int)local_d1c < (int)(local_1208 + 0x1f);
              local_d1c = local_d1c + 1) {
            local_ce0[(int)local_d1c] = '\0';
          }
        }
        for (local_d20 = 0; (int)local_d20 < (int)in_ECX; local_d20 = local_d20 + 1) {
          ptr[(long)(int)local_d20 + 0x1f] =
               (int8_t)*(undefined4 *)
                        (*(long *)(in_stack_00000008 + 0x10) +
                        (ulong)*(byte *)(in_RDX + (int)local_d20) * 4);
        }
        for (local_d20 = -0x1f; uVar96 = in_ECX, (int)local_d20 < 0; local_d20 = local_d20 + 1) {
          ptr[(long)(int)local_d20 + 0x1f] = '\0';
        }
        while (local_d20 = uVar96, (int)local_d20 < (int)(in_ECX + 0x1f)) {
          ptr[(long)(int)local_d20 + 0x1f] = '\0';
          uVar96 = local_d20 + 1;
        }
        for (local_d20 = 0; (int)local_d20 < (int)in_ECX; local_d20 = local_d20 + 1) {
          ptr_00[(long)(int)local_d20 + 0x1f] = -((char)local_d20 * local_cbc) - local_cb8;
          ptr_01[(long)(int)local_d20 + 0x1f] = local_d2b;
        }
        for (local_d20 = -0x1f; uVar96 = in_ECX, (int)local_d20 < 0; local_d20 = local_d20 + 1) {
          ptr_00[(long)(int)local_d20 + 0x1f] = local_d2b;
          ptr_01[(long)(int)local_d20 + 0x1f] = local_d2b;
        }
        while (local_d20 = uVar96, (int)local_d20 < (int)(in_ECX + 0x1f)) {
          ptr_00[(long)(int)local_d20 + 0x1f] = local_d2b;
          ptr_01[(long)(int)local_d20 + 0x1f] = local_d2b;
          uVar96 = local_d20 + 1;
        }
        ptr_00[0x1e] = '\0';
        for (local_d1c = 0; (int)local_d1c < (int)local_1208; local_d1c = local_d1c + 0x20) {
          local_fc0._16_8_ = uStack_bf0;
          local_fc0._0_16_ = auVar67;
          uStack_fa8 = uStack_be8;
          local_fe0._16_8_ = uStack_bf0;
          local_fe0._0_16_ = auVar67;
          uStack_fc8 = uStack_be8;
          local_1000._16_8_ = uStack_bf0;
          local_1000._0_16_ = auVar67;
          local_1000._24_8_ = uStack_be8;
          local_1020._16_8_ = uStack_bf0;
          local_1020._0_16_ = auVar67;
          uStack_1008 = uStack_be8;
          local_1040._16_8_ = uStack_930;
          local_1040._0_16_ = auVar74;
          local_1040._24_8_ = uStack_928;
          lVar33 = *(long *)(in_stack_00000008 + 8);
          iVar1 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_124c = (int)local_ce0[(int)local_d1c];
          }
          else {
            if ((int)local_d1c < (int)local_1208) {
              local_1250 = local_d1c;
            }
            else {
              local_1250 = local_1208 - 1;
            }
            local_124c = local_1250;
          }
          lVar34 = *(long *)(in_stack_00000008 + 8);
          iVar2 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1264 = (int)local_ce0[(int)(local_d1c + 1)];
          }
          else {
            if ((int)(local_d1c + 1) < (int)local_1208) {
              local_1268 = local_d1c + 1;
            }
            else {
              local_1268 = local_1208 - 1;
            }
            local_1264 = local_1268;
          }
          lVar35 = *(long *)(in_stack_00000008 + 8);
          iVar3 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_127c = (int)local_ce0[(int)(local_d1c + 2)];
          }
          else {
            if ((int)(local_d1c + 2) < (int)local_1208) {
              local_1280 = local_d1c + 2;
            }
            else {
              local_1280 = local_1208 - 1;
            }
            local_127c = local_1280;
          }
          lVar36 = *(long *)(in_stack_00000008 + 8);
          iVar4 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1294 = (int)local_ce0[(int)(local_d1c + 3)];
          }
          else {
            if ((int)(local_d1c + 3) < (int)local_1208) {
              local_1298 = local_d1c + 3;
            }
            else {
              local_1298 = local_1208 - 1;
            }
            local_1294 = local_1298;
          }
          lVar37 = *(long *)(in_stack_00000008 + 8);
          iVar5 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_12ac = (int)local_ce0[(int)(local_d1c + 4)];
          }
          else {
            if ((int)(local_d1c + 4) < (int)local_1208) {
              local_12b0 = local_d1c + 4;
            }
            else {
              local_12b0 = local_1208 - 1;
            }
            local_12ac = local_12b0;
          }
          lVar38 = *(long *)(in_stack_00000008 + 8);
          iVar6 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_12c4 = (int)local_ce0[(int)(local_d1c + 5)];
          }
          else {
            if ((int)(local_d1c + 5) < (int)local_1208) {
              local_12c8 = local_d1c + 5;
            }
            else {
              local_12c8 = local_1208 - 1;
            }
            local_12c4 = local_12c8;
          }
          lVar39 = *(long *)(in_stack_00000008 + 8);
          iVar7 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_12dc = (int)local_ce0[(int)(local_d1c + 6)];
          }
          else {
            if ((int)(local_d1c + 6) < (int)local_1208) {
              local_12e0 = local_d1c + 6;
            }
            else {
              local_12e0 = local_1208 - 1;
            }
            local_12dc = local_12e0;
          }
          lVar40 = *(long *)(in_stack_00000008 + 8);
          iVar8 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_12f4 = (int)local_ce0[(int)(local_d1c + 7)];
          }
          else {
            if ((int)(local_d1c + 7) < (int)local_1208) {
              local_12f8 = local_d1c + 7;
            }
            else {
              local_12f8 = local_1208 - 1;
            }
            local_12f4 = local_12f8;
          }
          lVar41 = *(long *)(in_stack_00000008 + 8);
          iVar9 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_130c = (int)local_ce0[(int)(local_d1c + 8)];
          }
          else {
            if ((int)(local_d1c + 8) < (int)local_1208) {
              local_1310 = local_d1c + 8;
            }
            else {
              local_1310 = local_1208 - 1;
            }
            local_130c = local_1310;
          }
          lVar42 = *(long *)(in_stack_00000008 + 8);
          iVar10 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1324 = (int)local_ce0[(int)(local_d1c + 9)];
          }
          else {
            if ((int)(local_d1c + 9) < (int)local_1208) {
              local_1328 = local_d1c + 9;
            }
            else {
              local_1328 = local_1208 - 1;
            }
            local_1324 = local_1328;
          }
          lVar43 = *(long *)(in_stack_00000008 + 8);
          iVar11 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_133c = (int)local_ce0[(int)(local_d1c + 10)];
          }
          else {
            if ((int)(local_d1c + 10) < (int)local_1208) {
              local_1340 = local_d1c + 10;
            }
            else {
              local_1340 = local_1208 - 1;
            }
            local_133c = local_1340;
          }
          lVar44 = *(long *)(in_stack_00000008 + 8);
          iVar12 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1354 = (int)local_ce0[(int)(local_d1c + 0xb)];
          }
          else {
            if ((int)(local_d1c + 0xb) < (int)local_1208) {
              local_1358 = local_d1c + 0xb;
            }
            else {
              local_1358 = local_1208 - 1;
            }
            local_1354 = local_1358;
          }
          lVar45 = *(long *)(in_stack_00000008 + 8);
          iVar13 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_136c = (int)local_ce0[(int)(local_d1c + 0xc)];
          }
          else {
            if ((int)(local_d1c + 0xc) < (int)local_1208) {
              local_1370 = local_d1c + 0xc;
            }
            else {
              local_1370 = local_1208 - 1;
            }
            local_136c = local_1370;
          }
          lVar46 = *(long *)(in_stack_00000008 + 8);
          iVar14 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1384 = (int)local_ce0[(int)(local_d1c + 0xd)];
          }
          else {
            if ((int)(local_d1c + 0xd) < (int)local_1208) {
              local_1388 = local_d1c + 0xd;
            }
            else {
              local_1388 = local_1208 - 1;
            }
            local_1384 = local_1388;
          }
          lVar47 = *(long *)(in_stack_00000008 + 8);
          iVar15 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_139c = (int)local_ce0[(int)(local_d1c + 0xe)];
          }
          else {
            if ((int)(local_d1c + 0xe) < (int)local_1208) {
              local_13a0 = local_d1c + 0xe;
            }
            else {
              local_13a0 = local_1208 - 1;
            }
            local_139c = local_13a0;
          }
          lVar48 = *(long *)(in_stack_00000008 + 8);
          iVar16 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_13b4 = (int)local_ce0[(int)(local_d1c + 0xf)];
          }
          else {
            if ((int)(local_d1c + 0xf) < (int)local_1208) {
              local_13b8 = local_d1c + 0xf;
            }
            else {
              local_13b8 = local_1208 - 1;
            }
            local_13b4 = local_13b8;
          }
          lVar49 = *(long *)(in_stack_00000008 + 8);
          iVar17 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_13cc = (int)local_ce0[(int)(local_d1c + 0x10)];
          }
          else {
            if ((int)(local_d1c + 0x10) < (int)local_1208) {
              local_13d0 = local_d1c + 0x10;
            }
            else {
              local_13d0 = local_1208 - 1;
            }
            local_13cc = local_13d0;
          }
          lVar50 = *(long *)(in_stack_00000008 + 8);
          iVar18 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_13e4 = (int)local_ce0[(int)(local_d1c + 0x11)];
          }
          else {
            if ((int)(local_d1c + 0x11) < (int)local_1208) {
              local_13e8 = local_d1c + 0x11;
            }
            else {
              local_13e8 = local_1208 - 1;
            }
            local_13e4 = local_13e8;
          }
          lVar51 = *(long *)(in_stack_00000008 + 8);
          iVar19 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_13fc = (int)local_ce0[(int)(local_d1c + 0x12)];
          }
          else {
            if ((int)(local_d1c + 0x12) < (int)local_1208) {
              local_1400 = local_d1c + 0x12;
            }
            else {
              local_1400 = local_1208 - 1;
            }
            local_13fc = local_1400;
          }
          lVar52 = *(long *)(in_stack_00000008 + 8);
          iVar20 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1414 = (int)local_ce0[(int)(local_d1c + 0x13)];
          }
          else {
            if ((int)(local_d1c + 0x13) < (int)local_1208) {
              local_1418 = local_d1c + 0x13;
            }
            else {
              local_1418 = local_1208 - 1;
            }
            local_1414 = local_1418;
          }
          lVar53 = *(long *)(in_stack_00000008 + 8);
          iVar21 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_142c = (int)local_ce0[(int)(local_d1c + 0x14)];
          }
          else {
            if ((int)(local_d1c + 0x14) < (int)local_1208) {
              local_1430 = local_d1c + 0x14;
            }
            else {
              local_1430 = local_1208 - 1;
            }
            local_142c = local_1430;
          }
          lVar54 = *(long *)(in_stack_00000008 + 8);
          iVar22 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1444 = (int)local_ce0[(int)(local_d1c + 0x15)];
          }
          else {
            if ((int)(local_d1c + 0x15) < (int)local_1208) {
              local_1448 = local_d1c + 0x15;
            }
            else {
              local_1448 = local_1208 - 1;
            }
            local_1444 = local_1448;
          }
          lVar55 = *(long *)(in_stack_00000008 + 8);
          iVar23 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_145c = (int)local_ce0[(int)(local_d1c + 0x16)];
          }
          else {
            if ((int)(local_d1c + 0x16) < (int)local_1208) {
              local_1460 = local_d1c + 0x16;
            }
            else {
              local_1460 = local_1208 - 1;
            }
            local_145c = local_1460;
          }
          lVar56 = *(long *)(in_stack_00000008 + 8);
          iVar24 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1474 = (int)local_ce0[(int)(local_d1c + 0x17)];
          }
          else {
            if ((int)(local_d1c + 0x17) < (int)local_1208) {
              local_1478 = local_d1c + 0x17;
            }
            else {
              local_1478 = local_1208 - 1;
            }
            local_1474 = local_1478;
          }
          lVar57 = *(long *)(in_stack_00000008 + 8);
          iVar25 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_148c = (int)local_ce0[(int)(local_d1c + 0x18)];
          }
          else {
            if ((int)(local_d1c + 0x18) < (int)local_1208) {
              local_1490 = local_d1c + 0x18;
            }
            else {
              local_1490 = local_1208 - 1;
            }
            local_148c = local_1490;
          }
          lVar58 = *(long *)(in_stack_00000008 + 8);
          iVar26 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_14a4 = (int)local_ce0[(int)(local_d1c + 0x19)];
          }
          else {
            if ((int)(local_d1c + 0x19) < (int)local_1208) {
              local_14a8 = local_d1c + 0x19;
            }
            else {
              local_14a8 = local_1208 - 1;
            }
            local_14a4 = local_14a8;
          }
          lVar59 = *(long *)(in_stack_00000008 + 8);
          iVar27 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_14bc = (int)local_ce0[(int)(local_d1c + 0x1a)];
          }
          else {
            if ((int)(local_d1c + 0x1a) < (int)local_1208) {
              local_14c0 = local_d1c + 0x1a;
            }
            else {
              local_14c0 = local_1208 - 1;
            }
            local_14bc = local_14c0;
          }
          lVar60 = *(long *)(in_stack_00000008 + 8);
          iVar28 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_14d4 = (int)local_ce0[(int)(local_d1c + 0x1b)];
          }
          else {
            if ((int)(local_d1c + 0x1b) < (int)local_1208) {
              local_14d8 = local_d1c + 0x1b;
            }
            else {
              local_14d8 = local_1208 - 1;
            }
            local_14d4 = local_14d8;
          }
          lVar61 = *(long *)(in_stack_00000008 + 8);
          iVar29 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_14ec = (int)local_ce0[(int)(local_d1c + 0x1c)];
          }
          else {
            if ((int)(local_d1c + 0x1c) < (int)local_1208) {
              local_14f0 = local_d1c + 0x1c;
            }
            else {
              local_14f0 = local_1208 - 1;
            }
            local_14ec = local_14f0;
          }
          lVar62 = *(long *)(in_stack_00000008 + 8);
          iVar30 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1504 = (int)local_ce0[(int)(local_d1c + 0x1d)];
          }
          else {
            if ((int)(local_d1c + 0x1d) < (int)local_1208) {
              local_1508 = local_d1c + 0x1d;
            }
            else {
              local_1508 = local_1208 - 1;
            }
            local_1504 = local_1508;
          }
          lVar63 = *(long *)(in_stack_00000008 + 8);
          iVar31 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_151c = (int)local_ce0[(int)(local_d1c + 0x1e)];
          }
          else {
            if ((int)(local_d1c + 0x1e) < (int)local_1208) {
              local_1520 = local_d1c + 0x1e;
            }
            else {
              local_1520 = local_1208 - 1;
            }
            local_151c = local_1520;
          }
          lVar64 = *(long *)(in_stack_00000008 + 8);
          iVar32 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1534 = (int)local_ce0[(int)(local_d1c + 0x1f)];
          }
          else {
            if ((int)(local_d1c + 0x1f) < (int)local_1208) {
              local_1538 = local_d1c + 0x1f;
            }
            else {
              local_1538 = local_1208 - 1;
            }
            local_1534 = local_1538;
          }
          auVar102 = vpslldq_avx2(ZEXT1632(stack0xfffffffffffff050),0xf);
          auVar100 = vpsrldq_avx2(_local_fc0,1);
          auVar100 = vpor_avx2(auVar102,auVar100);
          stack0xfffffffffffff050 = auVar100._16_16_;
          auVar75 = vpinsrb_avx(stack0xfffffffffffff050,(uint)(byte)ptr_00[0x1e],0xf);
          local_fc0._0_16_ = ZEXT116(0) * auVar75 + ZEXT116(1) * auVar100._0_16_;
          register0x00001210 = ZEXT116(0) * stack0xfffffffffffff050 + ZEXT116(1) * auVar75;
          auVar102 = vpslldq_avx2(ZEXT1632(stack0xfffffffffffff030),0xf);
          auVar100 = vpsrldq_avx2(_local_fe0,1);
          auVar100 = vpor_avx2(auVar102,auVar100);
          iVar98 = in_R8D + local_d1c * in_R9D;
          stack0xfffffffffffff030 = auVar100._16_16_;
          auVar75 = vpinsrb_avx(stack0xfffffffffffff030,
                                CONCAT31((int3)((uint)iVar98 >> 8),-(char)iVar98),0xf);
          local_fe0._0_16_ = ZEXT116(0) * auVar75 + ZEXT116(1) * auVar100._0_16_;
          register0x00001210 = ZEXT116(0) * stack0xfffffffffffff030 + ZEXT116(1) * auVar75;
          ptr_00[0x1e] = -(((char)local_d1c + ' ') * local_cbc) - local_cb8;
          for (local_d20 = 0; auVar100 = _local_fc0, (int)local_d20 < (int)(in_ECX + 0x1f);
              local_d20 = local_d20 + 1) {
            auVar103 = vpslldq_avx2(ZEXT1632(stack0xfffffffffffff030),0xf);
            auVar102 = vpsrldq_avx2(_local_fe0,1);
            auVar102 = vpor_avx2(auVar103,auVar102);
            _local_fc0 = auVar102._0_31_;
            uStack_fa8._7_1_ = ptr_00[(long)(int)local_d20 + 0x1f];
            auVar104 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffeff0),0xf);
            auVar103 = vpsrldq_avx2(_local_1020,1);
            auVar103 = vpor_avx2(auVar104,auVar103);
            _local_1020 = auVar103._0_31_;
            uStack_1008._7_1_ = ptr_01[(long)(int)local_d20 + 0x1f];
            auVar87._24_8_ = uStack_fa8;
            auVar87._0_24_ = auVar102._0_24_;
            auVar86._16_8_ = uStack_bb0;
            auVar86._0_16_ = auVar68;
            auVar86._24_8_ = uStack_ba8;
            auVar102 = vpsubsb_avx2(auVar87,auVar86);
            auVar85._24_8_ = uStack_1008;
            auVar85._0_24_ = auVar103._0_24_;
            auVar84._16_8_ = uStack_b70;
            auVar84._0_16_ = auVar69;
            auVar84._24_8_ = uStack_b68;
            auVar103 = vpsubsb_avx2(auVar85,auVar84);
            auVar102 = vpmaxsb_avx2(auVar102,auVar103);
            auVar103._16_8_ = uStack_bb0;
            auVar103._0_16_ = auVar68;
            auVar103._24_8_ = uStack_ba8;
            auVar103 = vpsubsb_avx2(_local_fe0,auVar103);
            auVar104._16_8_ = uStack_b70;
            auVar104._0_16_ = auVar69;
            auVar104._24_8_ = uStack_b68;
            auVar104 = vpsubsb_avx2(local_1000,auVar104);
            auVar103 = vpmaxsb_avx2(auVar103,auVar104);
            auVar75 = vpinsrb_avx(ZEXT116(*(byte *)(lVar64 + (long)(iVar32 * local_1534) * 4 +
                                                   (long)ptr[(long)(int)(local_d20 + -0x1f) + 0x1f]
                                                   * 4)),
                                  (uint)*(byte *)(lVar63 + (long)(iVar31 * local_151c) * 4 +
                                                 (long)ptr[(long)(int)(local_d20 + -0x1e) + 0x1f] *
                                                 4),1);
            auVar75 = vpinsrb_avx(auVar75,(uint)*(byte *)(lVar62 + (long)(iVar30 * local_1504) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0x1d) +
                                                                   0x1f] * 4),2);
            auVar75 = vpinsrb_avx(auVar75,(uint)*(byte *)(lVar61 + (long)(iVar29 * local_14ec) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0x1c) +
                                                                   0x1f] * 4),3);
            auVar75 = vpinsrb_avx(auVar75,(uint)*(byte *)(lVar60 + (long)(iVar28 * local_14d4) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0x1b) +
                                                                   0x1f] * 4),4);
            auVar75 = vpinsrb_avx(auVar75,(uint)*(byte *)(lVar59 + (long)(iVar27 * local_14bc) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0x1a) +
                                                                   0x1f] * 4),5);
            auVar75 = vpinsrb_avx(auVar75,(uint)*(byte *)(lVar58 + (long)(iVar26 * local_14a4) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0x19) +
                                                                   0x1f] * 4),6);
            auVar75 = vpinsrb_avx(auVar75,(uint)*(byte *)(lVar57 + (long)(iVar25 * local_148c) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0x18) +
                                                                   0x1f] * 4),7);
            auVar75 = vpinsrb_avx(auVar75,(uint)*(byte *)(lVar56 + (long)(iVar24 * local_1474) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0x17) +
                                                                   0x1f] * 4),8);
            auVar75 = vpinsrb_avx(auVar75,(uint)*(byte *)(lVar55 + (long)(iVar23 * local_145c) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0x16) +
                                                                   0x1f] * 4),9);
            auVar75 = vpinsrb_avx(auVar75,(uint)*(byte *)(lVar54 + (long)(iVar22 * local_1444) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0x15) +
                                                                   0x1f] * 4),10);
            auVar75 = vpinsrb_avx(auVar75,(uint)*(byte *)(lVar53 + (long)(iVar21 * local_142c) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0x14) +
                                                                   0x1f] * 4),0xb);
            auVar75 = vpinsrb_avx(auVar75,(uint)*(byte *)(lVar52 + (long)(iVar20 * local_1414) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0x13) +
                                                                   0x1f] * 4),0xc);
            auVar75 = vpinsrb_avx(auVar75,(uint)*(byte *)(lVar51 + (long)(iVar19 * local_13fc) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0x12) +
                                                                   0x1f] * 4),0xd);
            auVar75 = vpinsrb_avx(auVar75,(uint)*(byte *)(lVar50 + (long)(iVar18 * local_13e4) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0x11) +
                                                                   0x1f] * 4),0xe);
            auVar75 = vpinsrb_avx(auVar75,(uint)*(byte *)(lVar49 + (long)(iVar17 * local_13cc) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0x10) +
                                                                   0x1f] * 4),0xf);
            auVar76 = vpinsrb_avx(ZEXT116(*(byte *)(lVar48 + (long)(iVar16 * local_13b4) * 4 +
                                                   (long)ptr[(long)(int)(local_d20 + -0xf) + 0x1f] *
                                                   4)),
                                  (uint)*(byte *)(lVar47 + (long)(iVar15 * local_139c) * 4 +
                                                 (long)ptr[(long)(int)(local_d20 + -0xe) + 0x1f] * 4
                                                 ),1);
            auVar76 = vpinsrb_avx(auVar76,(uint)*(byte *)(lVar46 + (long)(iVar14 * local_1384) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0xd) +
                                                                   0x1f] * 4),2);
            auVar76 = vpinsrb_avx(auVar76,(uint)*(byte *)(lVar45 + (long)(iVar13 * local_136c) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0xc) +
                                                                   0x1f] * 4),3);
            auVar76 = vpinsrb_avx(auVar76,(uint)*(byte *)(lVar44 + (long)(iVar12 * local_1354) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -0xb) +
                                                                   0x1f] * 4),4);
            auVar76 = vpinsrb_avx(auVar76,(uint)*(byte *)(lVar43 + (long)(iVar11 * local_133c) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -10) +
                                                                   0x1f] * 4),5);
            auVar76 = vpinsrb_avx(auVar76,(uint)*(byte *)(lVar42 + (long)(iVar10 * local_1324) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -9) +
                                                                   0x1f] * 4),6);
            auVar76 = vpinsrb_avx(auVar76,(uint)*(byte *)(lVar41 + (long)(iVar9 * local_130c) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -8) +
                                                                   0x1f] * 4),7);
            auVar76 = vpinsrb_avx(auVar76,(uint)*(byte *)(lVar40 + (long)(iVar8 * local_12f4) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -7) +
                                                                   0x1f] * 4),8);
            auVar76 = vpinsrb_avx(auVar76,(uint)*(byte *)(lVar39 + (long)(iVar7 * local_12dc) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -6) +
                                                                   0x1f] * 4),9);
            auVar76 = vpinsrb_avx(auVar76,(uint)*(byte *)(lVar38 + (long)(iVar6 * local_12c4) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -5) +
                                                                   0x1f] * 4),10);
            auVar76 = vpinsrb_avx(auVar76,(uint)*(byte *)(lVar37 + (long)(iVar5 * local_12ac) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -4) +
                                                                   0x1f] * 4),0xb);
            auVar76 = vpinsrb_avx(auVar76,(uint)*(byte *)(lVar36 + (long)(iVar4 * local_1294) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -3) +
                                                                   0x1f] * 4),0xc);
            auVar76 = vpinsrb_avx(auVar76,(uint)*(byte *)(lVar35 + (long)(iVar3 * local_127c) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -2) +
                                                                   0x1f] * 4),0xd);
            auVar76 = vpinsrb_avx(auVar76,(uint)*(byte *)(lVar34 + (long)(iVar2 * local_1264) * 4 +
                                                         (long)ptr[(long)(int)(local_d20 + -1) +
                                                                   0x1f] * 4),0xe);
            auVar76 = vpinsrb_avx(auVar76,(uint)*(byte *)(lVar33 + (long)(iVar1 * local_124c) * 4 +
                                                         (long)ptr[(long)(int)local_d20 + 0x1f] * 4)
                                  ,0xf);
            uStack_9b0 = auVar76._0_8_;
            uStack_9a8 = auVar76._8_8_;
            auVar90._16_8_ = uStack_9b0;
            auVar90._0_16_ = auVar75;
            auVar90._24_8_ = uStack_9a8;
            auVar100 = vpaddsb_avx2(auVar100,auVar90);
            auVar100 = vpmaxsb_avx2(auVar100,auVar103);
            auVar104 = vpmaxsb_avx2(auVar100,auVar102);
            auVar91._16_8_ = uStack_a70;
            auVar91._0_16_ = auVar73;
            auVar91._24_8_ = uStack_a68;
            auVar100 = vpcmpeqb_avx2(local_1040,auVar91);
            _local_fe0 = vpblendvb_avx2(auVar104,local_fa0,auVar100);
            auVar93._16_8_ = uStack_bf0;
            auVar93._0_16_ = auVar67;
            auVar93._24_8_ = uStack_be8;
            _local_1020 = vpblendvb_avx2(auVar102,auVar93,auVar100);
            auVar92._16_8_ = uStack_bf0;
            auVar92._0_16_ = auVar67;
            auVar92._24_8_ = uStack_be8;
            local_1000 = vpblendvb_avx2(auVar103,auVar92,auVar100);
            if (0x1f < (int)local_d20) {
              local_da0 = vpminsb_avx2(local_da0,_local_fe0);
              local_dc0 = vpmaxsb_avx2(local_dc0,_local_fe0);
            }
            ptr_00[(long)(int)(local_d20 + -0x1f) + 0x1f] = local_fe0[0];
            ptr_01[(long)(int)(local_d20 + -0x1f) + 0x1f] = local_1020[0];
            auVar100 = vpcmpeqb_avx2(local_ec0,auVar77);
            auVar102 = vpcmpeqb_avx2(local_1040,auVar78);
            auVar100 = vpand_avx2(auVar100,auVar102);
            local_f00 = vpblendvb_avx2(local_f00,_local_fe0,auVar100);
            auVar89._16_8_ = uStack_b30;
            auVar89._0_16_ = auVar70;
            auVar89._24_8_ = uStack_b28;
            local_1040 = vpaddsb_avx2(local_1040,auVar89);
          }
          auVar88._16_8_ = uStack_af0;
          auVar88._0_16_ = auVar71;
          auVar88._24_8_ = uStack_ae8;
          local_ec0 = vpaddsb_avx2(local_ec0,auVar88);
          auVar83._16_8_ = uStack_ab0;
          auVar83._0_16_ = auVar72;
          auVar83._24_8_ = uStack_aa8;
          auVar105 = ZEXT3264(auVar83);
          local_fa0 = vpsubsb_avx2(local_fa0,auVar83);
        }
        for (local_d1c = 0; (int)local_d1c < 0x20; local_d1c = local_d1c + 1) {
          if ((char)local_d2b < (char)local_f00[0x17]) {
            local_d2b = local_f00[0x17];
          }
          auVar77 = vperm2i128_avx2(auVar105._0_32_,local_f00,0x28);
          auVar105 = ZEXT3264(auVar77);
          local_f00 = vpalignr_avx2(local_f00,auVar77,0xf);
        }
        auVar95._16_8_ = uStack_c70;
        auVar95._0_16_ = auVar65;
        auVar95._24_8_ = uStack_c68;
        auVar77 = vpcmpgtb_avx2(auVar95,local_da0);
        auVar94._16_8_ = uStack_c30;
        auVar94._0_16_ = auVar66;
        auVar94._24_8_ = uStack_c28;
        auVar78 = vpcmpgtb_avx2(local_dc0,auVar94);
        auVar77 = vpor_avx2(auVar77,auVar78);
        if ((((((((((((((((((((((((((((((((auVar77 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar77 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar77 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar77 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar77 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar77 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar77 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar77 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar77 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar77 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar77 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar77 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar77 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar77 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar77 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar77 >> 0x7f,0) != '\0') ||
                          (auVar77 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar77 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar77 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar77 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar77 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar77 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar77 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar77 >> 0xbf,0) != '\0') ||
                  (auVar77 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar77 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar77 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar77 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar77 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar77 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar77 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar77[0x1f] < '\0') {
          local_c98->flag = local_c98->flag | 0x40;
          local_d2b = 0;
          local_d24 = 0;
          local_d28 = 0;
        }
        local_c98->score = (int)(char)local_d2b;
        local_c98->end_query = local_d24;
        local_c98->end_ref = local_d28;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          parasail_free(local_ce0);
        }
      }
    }
  }
  return local_c98;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int8_t * restrict s1 = NULL;
    int8_t * restrict s2B = NULL;
    int8_t * restrict _H_pr = NULL;
    int8_t * restrict _F_pr = NULL;
    int8_t * restrict s2 = NULL;
    int8_t * restrict H_pr = NULL;
    int8_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMax;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 32; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi8(NEG_LIMIT);
    vOpen = _mm256_set1_epi8(open);
    vGap  = _mm256_set1_epi8(gap);
    vOne = _mm256_set1_epi8(1);
    vN = _mm256_set1_epi8(N);
    vGapN = _mm256_set1_epi8(gap*N);
    vNegOne = _mm256_set1_epi8(-1);
    vI = _mm256_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15,16,17,18,19,20,21,22,23,24,25,26,27,28,29,30,31);
    vJreset = _mm256_set_epi8(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15,-16,-17,-18,-19,-20,-21,-22,-23,-24,-25,-26,-27,-28,-29,-30,-31);
    vMax = vNegInf;
    vILimit = _mm256_set1_epi8(s1Len);
    vILimit1 = _mm256_subs_epi8(vILimit, vOne);
    vJLimit = _mm256_set1_epi8(s2Len);
    vJLimit1 = _mm256_subs_epi8(vJLimit, vOne);
    vIBoundary = _mm256_set_epi8(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap,
            -open-8*gap,
            -open-9*gap,
            -open-10*gap,
            -open-11*gap,
            -open-12*gap,
            -open-13*gap,
            -open-14*gap,
            -open-15*gap,
            -open-16*gap,
            -open-17*gap,
            -open-18*gap,
            -open-19*gap,
            -open-20*gap,
            -open-21*gap,
            -open-22*gap,
            -open-23*gap,
            -open-24*gap,
            -open-25*gap,
            -open-26*gap,
            -open-27*gap,
            -open-28*gap,
            -open-29*gap,
            -open-30*gap,
            -open-31*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int8_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int8_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int8_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int8_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        const int * const restrict matrow16 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+16] : ((i+16 >= s1Len) ? s1Len-1 : i+16))];
        const int * const restrict matrow17 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+17] : ((i+17 >= s1Len) ? s1Len-1 : i+17))];
        const int * const restrict matrow18 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+18] : ((i+18 >= s1Len) ? s1Len-1 : i+18))];
        const int * const restrict matrow19 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+19] : ((i+19 >= s1Len) ? s1Len-1 : i+19))];
        const int * const restrict matrow20 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+20] : ((i+20 >= s1Len) ? s1Len-1 : i+20))];
        const int * const restrict matrow21 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+21] : ((i+21 >= s1Len) ? s1Len-1 : i+21))];
        const int * const restrict matrow22 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+22] : ((i+22 >= s1Len) ? s1Len-1 : i+22))];
        const int * const restrict matrow23 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+23] : ((i+23 >= s1Len) ? s1Len-1 : i+23))];
        const int * const restrict matrow24 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+24] : ((i+24 >= s1Len) ? s1Len-1 : i+24))];
        const int * const restrict matrow25 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+25] : ((i+25 >= s1Len) ? s1Len-1 : i+25))];
        const int * const restrict matrow26 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+26] : ((i+26 >= s1Len) ? s1Len-1 : i+26))];
        const int * const restrict matrow27 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+27] : ((i+27 >= s1Len) ? s1Len-1 : i+27))];
        const int * const restrict matrow28 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+28] : ((i+28 >= s1Len) ? s1Len-1 : i+28))];
        const int * const restrict matrow29 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+29] : ((i+29 >= s1Len) ? s1Len-1 : i+29))];
        const int * const restrict matrow30 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+30] : ((i+30 >= s1Len) ? s1Len-1 : i+30))];
        const int * const restrict matrow31 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+31] : ((i+31 >= s1Len) ? s1Len-1 : i+31))];
        vNH = _mm256_srli_si256_rpl(vNH, 1);
        vNH = _mm256_insert_epi8_rpl(vNH, H_pr[-1], 31);
        vWH = _mm256_srli_si256_rpl(vWH, 1);
        vWH = _mm256_insert_epi8_rpl(vWH, -open - i*gap, 31);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 1);
            vNH = _mm256_insert_epi8_rpl(vNH, H_pr[j], 31);
            vF = _mm256_srli_si256_rpl(vF, 1);
            vF = _mm256_insert_epi8_rpl(vF, F_pr[j], 31);
            vF = _mm256_max_epi8(
                    _mm256_subs_epi8(vNH, vOpen),
                    _mm256_subs_epi8(vF, vGap));
            vE = _mm256_max_epi8(
                    _mm256_subs_epi8(vWH, vOpen),
                    _mm256_subs_epi8(vE, vGap));
            vMat = _mm256_set_epi8(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]],
                    matrow16[s2[j-16]],
                    matrow17[s2[j-17]],
                    matrow18[s2[j-18]],
                    matrow19[s2[j-19]],
                    matrow20[s2[j-20]],
                    matrow21[s2[j-21]],
                    matrow22[s2[j-22]],
                    matrow23[s2[j-23]],
                    matrow24[s2[j-24]],
                    matrow25[s2[j-25]],
                    matrow26[s2[j-26]],
                    matrow27[s2[j-27]],
                    matrow28[s2[j-28]],
                    matrow29[s2[j-29]],
                    matrow30[s2[j-30]],
                    matrow31[s2[j-31]]
                    );
            vNWH = _mm256_adds_epi8(vNWH, vMat);
            vWH = _mm256_max_epi8(vNWH, vE);
            vWH = _mm256_max_epi8(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi8(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-31] = (int8_t)_mm256_extract_epi8_rpl(vWH,0);
            F_pr[j-31] = (int8_t)_mm256_extract_epi8_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m256i cond_valid_I = _mm256_cmpeq_epi8(vI, vILimit1);
                __m256i cond_valid_J = _mm256_cmpeq_epi8(vJ, vJLimit1);
                __m256i cond_all = _mm256_and_si256(cond_valid_I, cond_valid_J);
                vMax = _mm256_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm256_adds_epi8(vJ, vOne);
        }
        vI = _mm256_adds_epi8(vI, vN);
        vIBoundary = _mm256_subs_epi8(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int8_t value;
        value = (int8_t) _mm256_extract_epi8_rpl(vMax, 31);
        if (value > score) {
            score = value;
        }
        vMax = _mm256_slli_si256_rpl(vMax, 1);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}